

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

void __thiscall File::output_binary(File *this,ofstream *out)

{
  Type TVar1;
  pointer pCVar2;
  pointer pcVar3;
  pointer pFVar4;
  char *pcVar5;
  variant_alternative_t<0UL,_variant<basic_string<char>,_int,_double>_> *pvVar6;
  variant_alternative_t<1UL,_variant<basic_string<char>,_int,_double>_> *pvVar7;
  variant_alternative_t<2UL,_variant<basic_string<char>,_int,_double>_> *pvVar8;
  char *pcVar9;
  int i;
  long lVar10;
  pointer pCVar11;
  Function *fun;
  pointer pFVar12;
  u2 v_3;
  anon_class_16_2_09cc686c writeNBytes;
  u2 functions_count;
  u2 constants_count;
  anon_class_8_1_5a786fbc to_binary;
  char bytes [8];
  undefined2 local_72;
  anon_class_16_2_09cc686c local_70;
  undefined2 local_5c;
  undefined2 local_5a;
  anon_class_8_1_5a786fbc local_58 [2];
  anon_class_16_2_09cc686c local_48;
  char local_38 [8];
  
  local_70.bytes = &local_38;
  local_70.out = out;
  std::ostream::write((char *)out,0x11b54d);
  std::ostream::write((char *)out,0x11bc8a);
  local_5a = (short)((uint)(*(int *)&(this->constants).
                                     super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->constants).
                                    super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 4) * -0x5555;
  pcVar5 = (char *)((long)&local_5a + 1);
  lVar10 = 0;
  do {
    (*local_70.bytes)[lVar10] = *pcVar5;
    lVar10 = lVar10 + 1;
    pcVar5 = pcVar5 + -1;
  } while (lVar10 != 2);
  std::ostream::write((char *)local_70.out,(long)local_70.bytes);
  pCVar11 = (this->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (this->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pCVar11 != pCVar2) {
    do {
      TVar1 = pCVar11->type;
      if (TVar1 == DOUBLE) {
        std::ostream::write((char *)out,0x11b554);
        pvVar8 = std::get<2ul,std::__cxx11::string,int,double>(&pCVar11->value);
        local_58[0].writeNBytes = (anon_class_16_2_09cc686c *)*pvVar8;
        pcVar5 = (char *)((long)&local_58[0].writeNBytes + 7);
        lVar10 = 0;
        do {
          (*local_70.bytes)[lVar10] = *pcVar5;
          lVar10 = lVar10 + 1;
          pcVar5 = pcVar5 + -1;
        } while (lVar10 != 8);
LAB_00110419:
        std::ostream::write((char *)local_70.out,(long)local_70.bytes);
      }
      else {
        if (TVar1 == INT) {
          std::ostream::write((char *)out,0x11b552);
          pvVar7 = std::get<1ul,std::__cxx11::string,int,double>(&pCVar11->value);
          local_58[0].writeNBytes._0_4_ = *pvVar7;
          pcVar5 = (char *)((long)&local_58[0].writeNBytes + 3);
          lVar10 = 0;
          do {
            (*local_70.bytes)[lVar10] = *pcVar5;
            lVar10 = lVar10 + 1;
            pcVar5 = pcVar5 + -1;
          } while (lVar10 != 4);
          goto LAB_00110419;
        }
        if (TVar1 != STRING) {
          __assert_fail("(\"unexpected error\", false)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/BUAA-SE-Compiling[P]c0-vm-cpp/src/file.cpp"
                        ,0x65,"void File::output_binary(std::ofstream &)");
        }
        std::ostream::write((char *)out,0x11bc8f);
        pvVar6 = std::get<0ul,std::__cxx11::string,int,double>(&pCVar11->value);
        pcVar3 = (pvVar6->_M_dataplus)._M_p;
        local_58[0].writeNBytes = &local_48;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_58,pcVar3,pcVar3 + pvVar6->_M_string_length);
        local_5c = SUB82(local_58[1].writeNBytes,0);
        pcVar5 = (char *)((long)&local_5c + 1);
        lVar10 = 0;
        do {
          (*local_70.bytes)[lVar10] = *pcVar5;
          lVar10 = lVar10 + 1;
          pcVar5 = pcVar5 + -1;
        } while (lVar10 != 2);
        std::ostream::write((char *)local_70.out,(long)local_70.bytes);
        std::ostream::write((char *)out,(long)local_58[0].writeNBytes);
        if (local_58[0].writeNBytes != &local_48) {
          operator_delete(local_58[0].writeNBytes,(ulong)(*local_48.bytes + 1));
        }
      }
      pCVar11 = pCVar11 + 1;
    } while (pCVar11 != pCVar2);
  }
  local_58[0].writeNBytes = &local_70;
  output_binary::anon_class_8_1_5a786fbc::operator()(local_58,&this->start);
  pcVar5 = (char *)((long)&local_5c + 1);
  local_5c = (undefined2)
             ((uint)(*(int *)&(this->functions).
                              super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->functions).
                             super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 5);
  lVar10 = 0;
  do {
    (*local_70.bytes)[lVar10] = *pcVar5;
    lVar10 = lVar10 + 1;
    pcVar5 = pcVar5 + -1;
  } while (lVar10 != 2);
  std::ostream::write((char *)local_70.out,(long)local_70.bytes);
  pFVar12 = (this->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pFVar4 = (this->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pFVar12 != pFVar4) {
    pcVar5 = (char *)((long)&local_72 + 1);
    do {
      local_72 = pFVar12->nameIndex;
      lVar10 = 0;
      pcVar9 = pcVar5;
      do {
        (*local_70.bytes)[lVar10] = *pcVar9;
        lVar10 = lVar10 + 1;
        pcVar9 = pcVar9 + -1;
      } while (lVar10 != 2);
      std::ostream::write((char *)local_70.out,(long)local_70.bytes);
      local_72 = pFVar12->paramSize;
      lVar10 = 0;
      pcVar9 = pcVar5;
      do {
        (*local_70.bytes)[lVar10] = *pcVar9;
        lVar10 = lVar10 + 1;
        pcVar9 = pcVar9 + -1;
      } while (lVar10 != 2);
      std::ostream::write((char *)local_70.out,(long)local_70.bytes);
      local_72 = pFVar12->level;
      lVar10 = 0;
      pcVar9 = pcVar5;
      do {
        (*local_70.bytes)[lVar10] = *pcVar9;
        lVar10 = lVar10 + 1;
        pcVar9 = pcVar9 + -1;
      } while (lVar10 != 2);
      std::ostream::write((char *)local_70.out,(long)local_70.bytes);
      output_binary::anon_class_8_1_5a786fbc::operator()(local_58,&pFVar12->instructions);
      pFVar12 = pFVar12 + 1;
    } while (pFVar12 != pFVar4);
  }
  return;
}

Assistant:

void File::output_binary(std::ofstream& out) {

    char bytes[8];
    const auto writeNBytes = [&](void* addr, int count) {
        assert(0 < count && count <= 8);
        char* p = reinterpret_cast<char*>(addr) + (count-1);
        for (int i = 0; i < count; ++i) {
            bytes[i] = *p--;
        }
        out.write(bytes, count);
    };

    // magic
    out.write("\x43\x30\x3A\x29", 4);
    // version
    out.write("\x00\x00\x00\x01", 4);
    // constants_count
    vm::u2 constants_count = constants.size();
    writeNBytes(&constants_count, sizeof constants_count);
    // constants
    for (auto& constant : constants) {
        switch (constant.type)
        {
        case vm::Constant::Type::STRING: {
            out.write("\x00", 1);
            std::string v = std::get<vm::str_t>(constant.value);
            vm::u2 len = v.length();
            writeNBytes(&len, sizeof len);
            out.write(v.c_str(), len);
        } break;
        case vm::Constant::Type::INT: {
            out.write("\x01", 1);
            vm::int_t v = std::get<vm::int_t>(constant.value);
            writeNBytes(&v, sizeof v);
        } break;
        case vm::Constant::Type::DOUBLE: {
            out.write("\x02", 1);
            vm::double_t v = std::get<vm::double_t>(constant.value);
            writeNBytes(&v, sizeof v);
        } break;
        default: assert(("unexpected error", false)); break;
        }
    }

    auto to_binary = [&](const std::vector<vm::Instruction>& v) {
        vm::u2 instructions_count = v.size();
        writeNBytes(&instructions_count, sizeof instructions_count);
        for (auto& ins : v) {
            vm::u1 op = static_cast<vm::u1>(ins.op); 
            writeNBytes(&op, sizeof op);
            if (auto it = vm::paramSizeOfOpCode.find(ins.op); it != vm::paramSizeOfOpCode.end()) {
                auto paramSizes = it->second;
                switch (paramSizes[0]) {
                #define CASE(n) case n: { vm::u##n x = ins.x; writeNBytes(&x, n); }
                CASE(1); break; 
                CASE(2); break;
                CASE(4); break;
                #undef CASE
                default: assert(("unexpected error", false));
                }
                if (paramSizes.size() == 2) {
                    switch (paramSizes[1]) {
                    #define CASE(n) case n: { vm::u##n y = ins.y; writeNBytes(&y, n); }
                    CASE(1); break; 
                    CASE(2); break;
                    CASE(4); break;
                    #undef CASE
                    default: assert(("unexpected error", false));
                    }
                }
            }
        }
    };

    // start
    to_binary(start);
    // functions_count
    vm::u2 functions_count = functions.size();
    writeNBytes(&functions_count, sizeof functions_count);
    // functions
    for (auto& fun : functions) {
        vm::u2 v;
        v = fun.nameIndex; writeNBytes(&v, sizeof v);
        v = fun.paramSize; writeNBytes(&v, sizeof v);
        v = fun.level;     writeNBytes(&v, sizeof v);
        to_binary(fun.instructions);
    }
}